

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

unsigned_long get_inc(_mdi *mdi,_note *nte)

{
  uint uVar1;
  unsigned_long freq;
  long note_f;
  int ch;
  _note *nte_local;
  _mdi *mdi_local;
  
  if (nte->patch->note == '\0') {
    uVar1 = nte->noteid & 0x7f;
  }
  else {
    uVar1 = (uint)nte->patch->note;
  }
  freq = (unsigned_long)(int)(uVar1 * 100);
  freq = mdi->channel[(int)(uint)nte->noteid >> 8].pitch_adjust + freq;
  if ((long)freq < 0) {
    freq = 0;
  }
  else if (0x319c < (long)freq) {
    freq = 0x319c;
  }
  return ((ulong)(freq_table[(long)freq % 0x4b0] >> (10U - (char)((long)freq / 0x4b0) & 0x1f)) /
          (ulong)(long)(int)(((uint)_WM_SampleRate * 100) / 0x400) << 10) /
         (ulong)nte->sample->inc_div;
}

Assistant:

static inline unsigned long int get_inc(struct _mdi *mdi, struct _note *nte) {
	int ch = nte->noteid >> 8;
	signed long int note_f;
	unsigned long int freq;

	if (nte->patch->note != 0) {
		note_f = nte->patch->note * 100;
	} else {
		note_f = (nte->noteid & 0x7f) * 100;
	}
	note_f += mdi->channel[ch].pitch_adjust;
	if (note_f < 0) {
		note_f = 0;
	} else if (note_f > 12700) {
		note_f = 12700;
	}
	freq = freq_table[(note_f % 1200)] >> (10 - (note_f / 1200));
	return (((freq / ((_WM_SampleRate * 100) / 1024)) * 1024
			/ nte->sample->inc_div));
}